

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall enact::Lexer::skipWhitespace(Lexer *this)

{
  pointer pcVar1;
  ulong uVar2;
  char cVar3;
  
  do {
    pcVar1 = (this->m_source)._M_dataplus._M_p;
    uVar2 = this->m_current;
    cVar3 = pcVar1[uVar2];
    if (cVar3 != '\t') {
      if (cVar3 == '\n') {
        this->m_line = this->m_line + 1;
      }
      else if ((cVar3 != '\r') && (cVar3 != ' ')) {
        if ((cVar3 == '/') && (pcVar1[uVar2 + 1] == '/')) {
          cVar3 = '/';
          while ((cVar3 != '\n' && (uVar2 < (this->m_source)._M_string_length))) {
            advance(this);
            uVar2 = this->m_current;
            cVar3 = (this->m_source)._M_dataplus._M_p[uVar2];
          }
        }
        return;
      }
    }
    advance(this);
  } while( true );
}

Assistant:

void Lexer::skipWhitespace() {
        while (true) {
            char c = peek();
            switch (c) {
                case '\n':
                    ++m_line;
                    // Fallthrough
                case ' ':
                case '\t':
                case '\r':
                    advance();
                    break;

                case '/':
                    if (peekNext() == '/') {
                        while (peek() != '\n' && !isAtEnd()) advance();
                    } else {
                        return;
                    }

                default:
                    return;
            }
        }
    }